

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O2

int CVmObjBigNum::compare_abs(char *ext1,char *ext2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  
  bVar6 = (byte)ext2[4] >> 3 & 1;
  if ((ext1[4] & 8U) == 0) {
    iVar5 = 1;
    if (bVar6 == 0) {
      if (*(short *)(ext1 + 2) <= *(short *)(ext2 + 2)) {
        if (*(short *)(ext1 + 2) < *(short *)(ext2 + 2)) {
          iVar5 = -1;
        }
        else {
          uVar1 = *(ushort *)ext1;
          uVar2 = *(ushort *)ext2;
          uVar8 = (uint)uVar1;
          uVar3 = uVar8;
          if (uVar1 < uVar2) {
            uVar3 = (uint)uVar2;
          }
          uVar4 = uVar8;
          if (uVar2 < uVar1) {
            uVar4 = (uint)uVar2;
          }
          uVar9 = (ulong)uVar4;
          pcVar10 = ext1;
          if (uVar1 < uVar2) {
            pcVar10 = ext2;
          }
          if ((1 < (ushort)uVar4) &&
             (iVar5 = memcmp(ext1 + 5,ext2 + 5,(ulong)(uVar4 >> 1)), iVar5 != 0)) {
            return iVar5;
          }
          if (((uVar4 & 1) == 0) ||
             (uVar7 = uVar9 - 1 >> 1,
             iVar5 = (uint)((byte)ext1[uVar7 + 5] >> 4) - (uint)((byte)ext2[uVar7 + 5] >> 4),
             iVar5 == 0)) {
            iVar5 = uVar4 * 4;
            do {
              if (uVar3 == uVar9) {
                return 0;
              }
              uVar7 = uVar9 >> 1;
              bVar6 = (byte)iVar5;
              uVar9 = uVar9 + 1;
              iVar5 = iVar5 + 4;
            } while (((byte)pcVar10[uVar7 + 5] >> (~bVar6 & 4) & 0xf) == 0);
            iVar5 = uVar8 - uVar2;
          }
        }
      }
      return iVar5;
    }
  }
  else {
    iVar5 = (int)(char)(bVar6 - 1);
  }
  return iVar5;
}

Assistant:

static int is_zero(const char *ext)
        { return (ext[VMBN_FLAGS] & VMBN_F_ZERO) != 0; }